

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureLevelStateQueryTests.cpp
# Opt level: O0

bool __thiscall
deqp::gles31::Functional::anon_unknown_1::TextureLevelBufferDataOffsetCase::checkTextureState
          (TextureLevelBufferDataOffsetCase *this,CallLogWrapper *gl,TextureGenerationSpec *spec)

{
  bool bVar1;
  bool local_21;
  int refValue;
  bool allOk;
  TextureGenerationSpec *spec_local;
  CallLogWrapper *gl_local;
  TextureLevelBufferDataOffsetCase *this_local;
  
  bVar1 = std::
          vector<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
          ::empty(&spec->levels);
  if (bVar1) {
    local_21 = verifyTextureLevelParameterEqual
                         (gl,spec->queryTarget,0,0x919d,0,(this->super_TextureLevelCase).m_type);
  }
  else {
    local_21 = verifyTextureLevelParameterEqual
                         (gl,spec->queryTarget,0,0x919d,spec->texBufferDataOffset,
                          (this->super_TextureLevelCase).m_type);
  }
  return local_21;
}

Assistant:

bool checkTextureState (glu::CallLogWrapper& gl, const TextureGenerationSpec& spec)
	{
		bool allOk = true;

		if (spec.levels.empty())
		{
			allOk &= verifyTextureLevelParameterEqual(gl, spec.queryTarget, 0, GL_TEXTURE_BUFFER_OFFSET, 0, m_type);
		}
		else
		{
			const int refValue = spec.texBufferDataOffset;

			allOk &= verifyTextureLevelParameterEqual(gl, spec.queryTarget, 0, GL_TEXTURE_BUFFER_OFFSET, refValue, m_type);
		}

		return allOk;
	}